

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFormatTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles2::Functional::CompressedCubeFormatCase::testFace
          (CompressedCubeFormatCase *this,CubeFace face)

{
  code *pcVar1;
  RenderContext *context;
  bool bVar2;
  int iVar3;
  int preferredWidth;
  int preferredHeight;
  deUint32 dVar4;
  undefined4 extraout_var;
  TestLog *this_00;
  undefined4 extraout_var_00;
  TextureCube *pTVar6;
  char *str;
  undefined4 extraout_var_01;
  PixelFormat *pPVar7;
  MessageBuilder *this_01;
  reference pvVar8;
  undefined4 extraout_var_02;
  ReferenceParams local_37c;
  TextureCubeView local_2e8;
  SurfaceAccess local_2b0;
  PixelBufferAccess local_290;
  MessageBuilder local_268;
  undefined1 local_e8 [8];
  vector<float,_std::allocator<float>_> texCoord;
  RGBA local_c8;
  RGBA local_c4;
  RGBA threshold;
  undefined1 local_b0 [8];
  Sampler sampler;
  undefined1 local_68 [8];
  Surface referenceFrame;
  Surface renderedFrame;
  RandomViewport viewport;
  TestLog *log;
  Functions *gl;
  CompressedCubeFormatCase *pCStack_10;
  CubeFace face_local;
  CompressedCubeFormatCase *this_local;
  long lVar5;
  
  gl._4_4_ = face;
  pCStack_10 = this;
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestNode.m_testCtx);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pTVar6 = glu::TextureCube::getRefTexture(this->m_texture);
  preferredWidth = tcu::TextureCube::getSize(pTVar6);
  pTVar6 = glu::TextureCube::getRefTexture(this->m_texture);
  preferredHeight = tcu::TextureCube::getSize(pTVar6);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar4 = deStringHash(str);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)&renderedFrame.m_pixels.m_cap,
             (RenderTarget *)CONCAT44(extraout_var_00,iVar3),preferredWidth,preferredHeight,
             dVar4 + gl._4_4_);
  tcu::Surface::Surface((Surface *)&referenceFrame.m_pixels.m_cap,viewport.x,viewport.y);
  tcu::Surface::Surface((Surface *)local_68,viewport.x,viewport.y);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xffffffffffffff40,0.0,0.0,0.0,0.0);
  tcu::Sampler::Sampler
            ((Sampler *)local_b0,CLAMP_TO_EDGE,CLAMP_TO_EDGE,CLAMP_TO_EDGE,NEAREST,NEAREST,0.0,true,
             COMPAREMODE_NONE,0,(Vec4 *)&stack0xffffffffffffff40,false,MODE_DEPTH);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar7 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_01,iVar3));
  local_c8 = tcu::PixelFormat::getColorThreshold(pPVar7);
  tcu::RGBA::RGBA((RGBA *)((long)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage + 4),1,1,1,1);
  local_c4 = tcu::operator+(&local_c8,
                            (RGBA *)((long)&texCoord.
                                            super__Vector_base<float,_std::allocator<float>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_e8);
  glu::TextureTestUtil::computeQuadTexCoordCube
            ((vector<float,_std::allocator<float>_> *)local_e8,gl._4_4_);
  tcu::TestLog::operator<<(&local_268,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  this_01 = tcu::MessageBuilder::operator<<(&local_268,(CubeFace *)((long)&gl + 4));
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_268);
  (**(code **)(lVar5 + 0x1a00))
            ((int)renderedFrame.m_pixels.m_cap,renderedFrame.m_pixels.m_cap._4_4_,viewport.x,
             viewport.y);
  (**(code **)(lVar5 + 8))(0x84c0);
  pcVar1 = *(code **)(lVar5 + 0xb8);
  dVar4 = glu::TextureCube::getGLTexture(this->m_texture);
  (*pcVar1)(0x8513,dVar4);
  (**(code **)(lVar5 + 0x1360))(0x8513,0x2802,0x812f);
  (**(code **)(lVar5 + 0x1360))(0x8513,0x2803,0x812f);
  (**(code **)(lVar5 + 0x1360))(0x8513,0x2801,0x2600);
  (**(code **)(lVar5 + 0x1360))(0x8513,0x2800,0x2600);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"Set texturing state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureFormatTests.cpp"
                  ,0x24c);
  pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_e8,0);
  deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
            (&this->m_renderer,0,pvVar8,TEXTURETYPE_CUBE);
  context = this->m_renderCtx;
  tcu::Surface::getAccess(&local_290,(Surface *)&referenceFrame.m_pixels.m_cap);
  glu::readPixels(context,(int)renderedFrame.m_pixels.m_cap,renderedFrame.m_pixels.m_cap._4_4_,
                  &local_290);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"glReadPixels()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureFormatTests.cpp"
                  ,0x250);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  pPVar7 = tcu::RenderTarget::getPixelFormat((RenderTarget *)CONCAT44(extraout_var_02,iVar3));
  tcu::SurfaceAccess::SurfaceAccess(&local_2b0,(Surface *)local_68,pPVar7);
  pTVar6 = glu::TextureCube::getRefTexture(this->m_texture);
  tcu::TextureCube::operator_cast_to_TextureCubeView(&local_2e8,pTVar6);
  pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_e8,0);
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            (&local_37c,TEXTURETYPE_CUBE,(Sampler *)local_b0,LODMODE_EXACT);
  glu::TextureTestUtil::sampleTexture(&local_2b0,&local_2e8,pvVar8,&local_37c);
  bVar2 = glu::TextureTestUtil::compareImages
                    (this_00,(Surface *)local_68,(Surface *)&referenceFrame.m_pixels.m_cap,local_c4)
  ;
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_e8);
  tcu::Surface::~Surface((Surface *)local_68);
  tcu::Surface::~Surface((Surface *)&referenceFrame.m_pixels.m_cap);
  return bVar2;
}

Assistant:

bool CompressedCubeFormatCase::testFace (tcu::CubeFace face)
{
	const glw::Functions&	gl					= m_renderCtx.getFunctions();
	TestLog&				log					= m_testCtx.getLog();
	RandomViewport			viewport			(m_renderCtx.getRenderTarget(), m_texture->getRefTexture().getSize(), m_texture->getRefTexture().getSize(), deStringHash(getName())+(deUint32)face);
	tcu::Surface			renderedFrame		(viewport.width, viewport.height);
	tcu::Surface			referenceFrame		(viewport.width, viewport.height);
	Sampler					sampler				(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::NEAREST, Sampler::NEAREST);
	tcu::RGBA				threshold			= m_renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
	vector<float>			texCoord;

	computeQuadTexCoordCube(texCoord, face);

	// \todo [2011-10-28 pyry] Image set name / section?
	log << TestLog::Message << face << TestLog::EndMessage;

	// Setup base viewport.
	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);

	// Bind to unit 0.
	gl.activeTexture(GL_TEXTURE0);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_texture->getGLTexture());

	// Setup nearest neighbor filtering and clamp-to-edge.
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_NEAREST);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Set texturing state");

	m_renderer.renderQuad(0, &texCoord[0], TEXTURETYPE_CUBE);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, renderedFrame.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels()");

	// Compute reference.
	sampleTexture(tcu::SurfaceAccess(referenceFrame, m_renderCtx.getRenderTarget().getPixelFormat()), m_texture->getRefTexture(), &texCoord[0], ReferenceParams(TEXTURETYPE_CUBE, sampler));

	// Compare and log.
	return compareImages(log, referenceFrame, renderedFrame, threshold);
}